

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

size_t __thiscall
CDBWrapper::EstimateSizeImpl(CDBWrapper *this,Span<const_std::byte> key1,Span<const_std::byte> key2)

{
  LevelDBContext *pLVar1;
  long in_FS_OFFSET;
  byte *local_40;
  size_t local_38;
  byte *local_30;
  size_t local_28;
  uint64_t size;
  long local_18;
  
  local_28 = key2.m_size;
  local_30 = key2.m_data;
  local_38 = key1.m_size;
  local_40 = key1.m_data;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  size = 0;
  pLVar1 = DBContext(this);
  (*pLVar1->pdb->_vptr_DB[10])(pLVar1->pdb,&local_40,1,&size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return size;
  }
  __stack_chk_fail();
}

Assistant:

size_t CDBWrapper::EstimateSizeImpl(Span<const std::byte> key1, Span<const std::byte> key2) const
{
    leveldb::Slice slKey1(CharCast(key1.data()), key1.size());
    leveldb::Slice slKey2(CharCast(key2.data()), key2.size());
    uint64_t size = 0;
    leveldb::Range range(slKey1, slKey2);
    DBContext().pdb->GetApproximateSizes(&range, 1, &size);
    return size;
}